

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDisallowedCommand.h
# Opt level: O0

cmCommand * __thiscall cmDisallowedCommand::Clone(cmDisallowedCommand *this)

{
  int iVar1;
  cmDisallowedCommand *this_00;
  undefined4 extraout_var;
  cmDisallowedCommand *this_local;
  
  this_00 = (cmDisallowedCommand *)operator_new(0x48);
  iVar1 = (*this->Command->_vptr_cmCommand[6])();
  cmDisallowedCommand(this_00,(cmCommand *)CONCAT44(extraout_var,iVar1),this->Policy,this->Message);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() override
  {
    return new cmDisallowedCommand(this->Command->Clone(), this->Policy,
                                   this->Message);
  }